

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

sx_job_context * sx_job_create_context(sx_alloc *alloc,sx_job_context_desc *desc)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  uint32_t tid;
  sx_job_context *psVar5;
  sx_tls pvVar6;
  sx__job_thread_data *data;
  sx_fiber_t pvVar7;
  sx_pool *psVar8;
  long lVar9;
  uint32_t *__s;
  sx_thread **ppsVar10;
  size_t sVar11;
  sx_thread *psVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  sx_job_context *psVar16;
  uint uVar17;
  void *user_data2;
  void *pvVar18;
  sx_fiber_stack stack;
  char name [32];
  char local_58 [40];
  
  psVar5 = (sx_job_context *)
           (*alloc->alloc_cb)((void *)0x0,0x1c0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (psVar5 == (sx_job_context *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x233);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x233,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar5 = (sx_job_context *)(*pcVar1)();
    return psVar5;
  }
  memset(psVar5,0,0x1c0);
  psVar5->alloc = alloc;
  iVar4 = desc->num_threads;
  if (iVar4 < 1) {
    iVar4 = sx_os_numcores();
    iVar4 = iVar4 + -1;
  }
  psVar5->num_threads = iVar4;
  pvVar6 = sx_tls_create();
  psVar5->thread_tls = pvVar6;
  iVar4 = 0x100000;
  if (0 < desc->fiber_stack_sz) {
    iVar4 = desc->fiber_stack_sz;
  }
  psVar5->stack_sz = iVar4;
  psVar5->thread_init_cb = desc->thread_init_cb;
  psVar5->thread_shutdown_cb = desc->thread_shutdown_cb;
  psVar5->thread_user = desc->thread_user_data;
  uVar17 = 0x40;
  if (0 < desc->max_fibers) {
    uVar17 = desc->max_fibers;
  }
  sx_semaphore_init(&psVar5->sem);
  tid = sx_thread_tid();
  data = sx__job_create_tdata(alloc,tid,0,true);
  if (data == (sx__job_thread_data *)0x0) {
    (*alloc->alloc_cb)(psVar5,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
    psVar16 = (sx_job_context *)0x0;
  }
  else {
    sx_tls_set(psVar5->thread_tls,data);
    uVar2 = (data->selector_stack).sptr;
    uVar3 = (data->selector_stack).ssize;
    stack.ssize = uVar3;
    stack.sptr = (void *)uVar2;
    stack._12_4_ = 0;
    pvVar7 = sx_fiber_create(stack,sx__job_selector_main_thrd);
    data->selector_fiber = pvVar7;
    uVar15 = uVar17 + 0xf & 0xfffffff0;
    uVar13 = (ulong)uVar15;
    psVar8 = (sx_pool *)
             (*alloc->alloc_cb)((void *)0x0,uVar13 << 7 | 0x30,0x10,
                                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                                ,
                                "sx_job_context *sx_job_create_context(const sx_alloc *, const sx_job_context_desc *)"
                                ,0x24d,alloc->user_data);
    if (psVar8 == (sx_pool *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
                 0x5b);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x5b,"Out of memory");
      pcVar1 = (code *)swi(3);
      psVar5 = (sx_job_context *)(*pcVar1)();
      return psVar5;
    }
    psVar8->item_sz = 0x78;
    psVar8->capacity = uVar15;
    psVar8->pages = (sx__pool_page *)(psVar8 + 1);
    *(uint *)&psVar8[2].pages = uVar15;
    *(sx_pool **)(psVar8 + 1) = psVar8 + 3;
    psVar8[1].pages = (sx__pool_page *)(&psVar8[3].item_sz + uVar13 * 2);
    psVar8[2].item_sz = 0;
    psVar8[2].capacity = 0;
    if (0 < (int)uVar15) {
      lVar9 = 0;
      do {
        *(long *)(*(long *)(psVar8 + 1) + -8 + uVar13 * 8) = (long)&(psVar8[1].pages)->ptrs + lVar9;
        lVar9 = lVar9 + 0x78;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    memset(psVar8[1].pages,0,(ulong)(uVar15 * 0x78));
    psVar5->job_pool = psVar8;
    psVar8 = (sx_pool *)
             (*alloc->alloc_cb)((void *)0x0,0xc30,0x10,
                                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                                ,
                                "sx_job_context *sx_job_create_context(const sx_alloc *, const sx_job_context_desc *)"
                                ,0x24e,alloc->user_data);
    if (psVar8 == (sx_pool *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
                 0x5b);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x5b,"Out of memory");
      pcVar1 = (code *)swi(3);
      psVar5 = (sx_job_context *)(*pcVar1)();
      return psVar5;
    }
    psVar8->item_sz = 4;
    psVar8->capacity = 0x100;
    psVar8->pages = (sx__pool_page *)(psVar8 + 1);
    *(undefined4 *)&psVar8[2].pages = 0x100;
    *(sx_pool **)(psVar8 + 1) = psVar8 + 3;
    psVar8[1].pages = (sx__pool_page *)(psVar8 + 0x83);
    psVar8[2].item_sz = 0;
    psVar8[2].capacity = 0;
    lVar9 = 0x1fe;
    lVar14 = 0;
    do {
      *(long *)(*(long *)(psVar8 + 1) + lVar9 * 4) = (long)&(psVar8[1].pages)->ptrs + lVar14;
      lVar14 = lVar14 + 4;
      lVar9 = lVar9 + -2;
    } while (lVar14 != 0x400);
    memset(psVar8[1].pages,0,0x400);
    psVar5->counter_pool = psVar8;
    psVar16 = (sx_job_context *)0x0;
    if ((psVar8 != (sx_pool *)0x0) && (psVar5->job_pool != (sx_pool *)0x0)) {
      memset(psVar5->job_pool->pages->buff,0,(ulong)uVar17 * 0x78);
      __s = (uint32_t *)
            (*alloc->alloc_cb)((void *)0x0,(long)psVar5->num_threads * 4 + 4,0,(char *)0x0,
                               (char *)0x0,0,alloc->user_data);
      psVar5->tags = __s;
      memset(__s,0xff,(long)psVar5->num_threads * 4 + 4);
      psVar16 = psVar5;
      if (0 < (long)psVar5->num_threads) {
        ppsVar10 = (sx_thread **)
                   (*alloc->alloc_cb)((void *)0x0,(long)psVar5->num_threads << 3,0,(char *)0x0,
                                      (char *)0x0,0,alloc->user_data);
        psVar5->threads = ppsVar10;
        if (ppsVar10 == (sx_thread **)0x0) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                            ,0x25a,"ctx->threads");
          pcVar1 = (code *)swi(3);
          psVar5 = (sx_job_context *)(*pcVar1)();
          return psVar5;
        }
        if (0 < psVar5->num_threads) {
          user_data2 = (void *)0x0;
          do {
            pvVar18 = (void *)((long)user_data2 + 1);
            sx_snprintf(local_58,0x20,"sx_job_thread(%d)",(ulong)pvVar18 & 0xffffffff);
            sVar11 = sx_os_minstacksz();
            psVar12 = sx_thread_create(alloc,sx__job_thread_fn,psVar5,(int)sVar11,local_58,
                                       user_data2);
            psVar5->threads[(long)user_data2] = psVar12;
            if (psVar5->threads[(long)user_data2] == (sx_thread *)0x0) {
              sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                                ,0x261,"sx_thread_create failed!");
              pcVar1 = (code *)swi(3);
              psVar5 = (sx_job_context *)(*pcVar1)();
              return psVar5;
            }
            user_data2 = pvVar18;
          } while ((long)pvVar18 < (long)psVar5->num_threads);
        }
      }
    }
  }
  return psVar16;
}

Assistant:

sx_job_context* sx_job_create_context(const sx_alloc* alloc, const sx_job_context_desc* desc)
{
    sx_job_context* ctx = (sx_job_context*)sx_malloc(alloc, sizeof(sx_job_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_job_context));

    ctx->alloc = alloc;
    ctx->num_threads = desc->num_threads > 0 ? desc->num_threads : (sx_os_numcores() - 1);
    ctx->thread_tls = sx_tls_create();
    ctx->stack_sz = desc->fiber_stack_sz > 0 ? desc->fiber_stack_sz : DEFAULT_FIBER_STACK_SIZE;
    ctx->thread_init_cb = desc->thread_init_cb;
    ctx->thread_shutdown_cb = desc->thread_shutdown_cb;
    ctx->thread_user = desc->thread_user_data;
    int max_fibers = desc->max_fibers > 0 ? desc->max_fibers : DEFAULT_MAX_FIBERS;

    sx_semaphore_init(&ctx->sem);

    sx__job_thread_data* main_tdata = sx__job_create_tdata(alloc, sx_thread_tid(), 0, true);
    if (!main_tdata) {
        sx_free(alloc, ctx);
        return NULL;
    }
    sx_tls_set(ctx->thread_tls, main_tdata);
    main_tdata->selector_fiber =
        sx_fiber_create(main_tdata->selector_stack, sx__job_selector_main_thrd);

    // pools
    ctx->job_pool = sx_pool_create(alloc, sizeof(sx__job), max_fibers);
    ctx->counter_pool = sx_pool_create(alloc, sizeof(int), COUNTER_POOL_SIZE);
    if (!ctx->job_pool || !ctx->counter_pool)
        return NULL;
    sx_memset(ctx->job_pool->pages->buff, 0x0, sizeof(sx__job) * max_fibers);

    // keep tags in an array for evaluating num_jobs
    ctx->tags = sx_malloc(alloc, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));
    sx_memset(ctx->tags, 0xff, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));

    // Worker threads
    if (ctx->num_threads > 0) {
        ctx->threads = (sx_thread**)sx_malloc(alloc, sizeof(sx_thread*) * ctx->num_threads);
        sx_assert(ctx->threads);

        for (int i = 0; i < ctx->num_threads; i++) {
            char name[32];
            sx_snprintf(name, sizeof(name), "sx_job_thread(%d)", i + 1);
            ctx->threads[i] = sx_thread_create(alloc, sx__job_thread_fn, ctx, (int)sx_os_minstacksz(),
                                               name, (void*)(intptr_t)i);
            sx_assertf(ctx->threads[i], "sx_thread_create failed!");
        }
    }

    return ctx;
}